

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverCE.h
# Opt level: O0

double __thiscall BGIP_SolverCE::Solve(BGIP_SolverCE *this)

{
  value_type pPVar1;
  timeval tVar2;
  timeval tVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  value_type vVar7;
  undefined8 *puVar8;
  type pBVar9;
  ulong uVar10;
  undefined8 uVar11;
  element_type *peVar12;
  reference ppPVar13;
  const_reference pvVar14;
  reference pvVar15;
  size_type sVar16;
  reference ppJVar17;
  ostream *poVar18;
  ofstream *this_00;
  BayesianGameIdenticalPayoffSolver *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar19 [16];
  undefined1 extraout_var [56];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> sVar23;
  double delta;
  double v_best_this_iter;
  JPPVValuePair *back_1;
  JPPVValuePair *back;
  JPPVValuePair *polval;
  Index ja;
  Index agentI_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indAcs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indTypes;
  double P_jt;
  Index jt;
  BayesianGameIdenticalPayoffInterface *bgipRawPtr;
  double v;
  Index agentI_1;
  vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *BGpolicies;
  shared_ptr<JointPolicyPureVector> p_jpol;
  Index sample;
  double v_gamma;
  double v_xth_best;
  list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> best_samples;
  Index iter;
  Index restart;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ta_vec;
  size_t nrAcs;
  size_t nrTypes;
  Index agentI;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  Xi;
  size_t nrJT;
  size_t nrAgents;
  timeval cur_time;
  timeval start_time;
  JointPolicyPureVector jpol_best;
  double v_best;
  JointPolicyPureVector *in_stack_fffffffffffffaf8;
  BayesianGameBase *pBVar24;
  ofstream *in_stack_fffffffffffffb00;
  allocator_type *in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb10;
  PolicyDomainCategory in_stack_fffffffffffffb14;
  undefined4 uVar25;
  I_PtPDpure_constPtr *in_stack_fffffffffffffb18;
  shared_ptr<JointPolicyPureVector> *in_stack_fffffffffffffb20;
  ofstream *in_stack_fffffffffffffb30;
  I_PtPDpure_constPtr *in_stack_fffffffffffffb38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb40;
  Index in_stack_fffffffffffffb54;
  BayesianGameBase *in_stack_fffffffffffffb58;
  PolicyPureVector *in_stack_fffffffffffffb60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  shared_ptr<JointPolicyPureVector> local_348;
  __time_t local_338;
  __suseconds_t _Stack_330;
  __time_t local_328;
  __suseconds_t _Stack_320;
  double local_318;
  BayesianGameBase *local_310;
  value_type local_308;
  value_type in_stack_fffffffffffffd00;
  JPPVValuePair *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  uint in_stack_fffffffffffffd14;
  undefined1 local_2e0 [24];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_2c8;
  double local_2c0;
  allocator<char> local_2b1;
  string local_2b0 [36];
  uint local_28c;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_288;
  element_type *local_278;
  double local_270;
  uint local_264;
  vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *local_260;
  undefined1 local_252;
  undefined1 local_250 [16];
  shared_ptr<const_Interface_ProblemToPolicyDiscretePure> local_240;
  shared_ptr<JointPolicyPureVector> local_230;
  uint local_21c;
  PolicyPureVector *local_218;
  double local_210;
  list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> local_208;
  allocator<char> local_1e9;
  string local_1e8 [36];
  uint local_1c4;
  uint local_1c0;
  double local_1b8;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_180;
  undefined8 local_170;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_168;
  undefined8 local_158;
  uint local_150;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  local_148;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_130;
  ulong local_120;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_118;
  ulong local_108;
  __time_t local_100;
  __suseconds_t _Stack_f8;
  timeval local_f0 [2];
  undefined1 local_c8 [16];
  shared_ptr<const_Interface_ProblemToPolicyDiscretePure> local_b8;
  JointPolicyPureVector local_a8 [152];
  BayesianGameBase *local_10;
  undefined1 auVar20 [64];
  
  (*(code *)**(undefined8 **)in_RDI)();
  local_10 = (BayesianGameBase *)0xffefffffffffffff;
  sVar23 = BayesianGameIdenticalPayoffSolver::GetBGIPI
                     ((BayesianGameIdenticalPayoffSolver *)in_stack_fffffffffffffaf8);
  boost::shared_ptr<Interface_ProblemToPolicyDiscretePure_const>::
  shared_ptr<BayesianGameIdenticalPayoffInterface_const>(&local_b8,local_c8,sVar23.pn.pi_.pi_);
  JointPolicyPureVector::JointPolicyPureVector
            ((JointPolicyPureVector *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
             in_stack_fffffffffffffb14);
  boost::shared_ptr<const_Interface_ProblemToPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *)0x139179);
  boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
            ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x139186);
  iVar6 = gettimeofday(local_f0,(__timezone_ptr_t)0x0);
  if (iVar6 == 0) {
    BayesianGameIdenticalPayoffSolver::GetBGIPI
              ((BayesianGameIdenticalPayoffSolver *)in_stack_fffffffffffffaf8);
    pBVar9 = boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->(&local_118);
    uVar10 = (**(code **)(*(long *)pBVar9 + 0x18))();
    boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
              ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x13926a);
    local_108 = uVar10;
    BayesianGameIdenticalPayoffSolver::GetBGIPI
              ((BayesianGameIdenticalPayoffSolver *)in_stack_fffffffffffffaf8);
    boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->(&local_130);
    uVar10 = BayesianGameBase::GetNrJointTypes();
    boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
              ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x1392cc);
    local_120 = uVar10;
    std::
    allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::allocator((allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                 *)0x139301);
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::vector((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
              *)in_stack_fffffffffffffb20,(size_type)in_stack_fffffffffffffb18,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
    std::
    allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::~allocator((allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                  *)0x13932d);
    for (local_150 = 0; local_150 < local_108; local_150 = local_150 + 1) {
      BayesianGameIdenticalPayoffSolver::GetBGIPI
                ((BayesianGameIdenticalPayoffSolver *)in_stack_fffffffffffffaf8);
      pBVar9 = boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->(&local_168)
      ;
      uVar11 = (**(code **)(*(long *)pBVar9 + 0x28))(pBVar9,local_150,0,999999);
      boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
                ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x1393b1);
      local_158 = uVar11;
      BayesianGameIdenticalPayoffSolver::GetBGIPI
                ((BayesianGameIdenticalPayoffSolver *)in_stack_fffffffffffffaf8);
      pBVar9 = boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->(&local_180)
      ;
      uVar11 = (**(code **)(*(long *)pBVar9 + 0x20))(pBVar9,local_150);
      auVar20._8_56_ = extraout_var;
      auVar20._0_8_ = extraout_XMM0_Qa;
      auVar19 = auVar20._0_16_;
      boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
                ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x13941e);
      auVar19 = vcvtusi2sd_avx512f(auVar19,uVar11);
      local_1b8 = 1.0 / auVar19._0_8_;
      local_170 = uVar11;
      std::allocator<double>::allocator((allocator<double> *)0x13947e);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb20,
                 (size_type)in_stack_fffffffffffffb18,
                 (value_type_conflict *)
                 CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                 in_stack_fffffffffffffb08);
      std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
                ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x1394ba);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffffb20,(size_type)in_stack_fffffffffffffb18,
               (value_type *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
               (allocator_type *)in_stack_fffffffffffffb08);
      std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
                ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x1394ee);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
      std::allocator<double>::~allocator((allocator<double> *)0x139508);
      std::
      vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
      ::at((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
            *)in_stack_fffffffffffffb00,(size_type)in_stack_fffffffffffffaf8);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                  in_stack_fffffffffffffb98);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
    }
    for (local_1c0 = 0; (ulong)local_1c0 < *(ulong *)(in_RDI + 0x108); local_1c0 = local_1c0 + 1) {
      for (local_1c4 = 0; (ulong)local_1c4 < *(ulong *)(in_RDI + 0x110); local_1c4 = local_1c4 + 1)
      {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffb40,(char *)in_stack_fffffffffffffb38,
                   (allocator<char> *)in_stack_fffffffffffffb30);
        (**(code **)(*(long *)in_RDI + 8))(in_RDI,local_1e8);
        std::__cxx11::string::~string(local_1e8);
        std::allocator<char>::~allocator(&local_1e9);
        std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::list
                  ((list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *)0x139778);
        local_210 = -1.79769313486232e+308;
        local_218 = (PolicyPureVector *)0xffefffffffffffff;
        for (local_21c = 0; (ulong)local_21c < *(ulong *)(in_RDI + 0x118); local_21c = local_21c + 1
            ) {
          operator_new(0x98);
          local_252 = 1;
          sVar23 = BayesianGameIdenticalPayoffSolver::GetBGIPI
                             ((BayesianGameIdenticalPayoffSolver *)in_stack_fffffffffffffaf8);
          boost::shared_ptr<Interface_ProblemToPolicyDiscretePure_const>::
          shared_ptr<BayesianGameIdenticalPayoffInterface_const>
                    (&local_240,local_250,sVar23.pn.pi_.pi_);
          JointPolicyPureVector::JointPolicyPureVector
                    ((JointPolicyPureVector *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
          local_252 = 0;
          boost::shared_ptr<JointPolicyPureVector>::shared_ptr<JointPolicyPureVector>
                    (in_stack_fffffffffffffb20,(JointPolicyPureVector *)in_stack_fffffffffffffb18);
          boost::shared_ptr<const_Interface_ProblemToPolicyDiscretePure>::~shared_ptr
                    ((shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *)0x139854);
          boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
                    ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x139861);
          boost::shared_ptr<JointPolicyPureVector>::operator->(&local_230);
          local_260 = JointPolicyPureVector::GetIndividualPolicies
                                ((JointPolicyPureVector *)0x139885);
          for (local_264 = 0; local_264 < local_108; local_264 = local_264 + 1) {
            std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::at
                      ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *)
                       in_stack_fffffffffffffb00,(size_type)in_stack_fffffffffffffaf8);
            std::
            vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
            ::operator[](&local_148,(ulong)local_264);
            SampleIndividualPolicy
                      (in_stack_fffffffffffffb60,
                       (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)in_stack_fffffffffffffb58);
          }
          local_270 = 0.0;
          BayesianGameIdenticalPayoffSolver::GetBGIPI
                    ((BayesianGameIdenticalPayoffSolver *)in_stack_fffffffffffffaf8);
          peVar12 = boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::get(&local_288);
          boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
                    ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x139a59);
          local_278 = peVar12;
          for (local_28c = 0; local_28c < local_120; local_28c = local_28c + 1) {
            if (local_28c % 10000 == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffb40,(char *)in_stack_fffffffffffffb38,
                         (allocator<char> *)in_stack_fffffffffffffb30);
              (**(code **)(*(long *)in_RDI + 8))(in_RDI,local_2b0);
              std::__cxx11::string::~string(local_2b0);
              std::allocator<char>::~allocator(&local_2b1);
            }
            local_2c0 = (double)(**(code **)(*(long *)local_278 + 0x68))(local_278,local_28c);
            if (0.0 < local_2c0) {
              local_2c8 = BayesianGameBase::JointToIndividualTypeIndices
                                    (in_stack_fffffffffffffb58,in_stack_fffffffffffffb54);
              std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x139bff);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         in_stack_fffffffffffffb20,(size_type)in_stack_fffffffffffffb18,
                         (value_type_conflict2 *)
                         CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                         (allocator_type *)in_stack_fffffffffffffb08);
              std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x139c33);
              for (in_stack_fffffffffffffd14 = 0; in_stack_fffffffffffffd14 < local_108;
                  in_stack_fffffffffffffd14 = in_stack_fffffffffffffd14 + 1) {
                ppPVar13 = std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::at
                                     ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>
                                       *)in_stack_fffffffffffffb00,
                                      (size_type)in_stack_fffffffffffffaf8);
                pPVar1 = *ppPVar13;
                pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     in_stack_fffffffffffffb00,(size_type)in_stack_fffffffffffffaf8)
                ;
                vVar7 = (**(code **)(*(long *)pPVar1 + 0x40))(pPVar1,*pvVar14);
                pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     in_stack_fffffffffffffb00,(size_type)in_stack_fffffffffffffaf8)
                ;
                *pvVar15 = vVar7;
              }
              in_stack_fffffffffffffd10 =
                   (**(code **)(*(long *)local_278 + 0x38))(local_278,local_2e0);
              dVar4 = local_2c0;
              auVar19._0_8_ =
                   (**(code **)(*(long *)local_278 + 0x80))
                             (local_278,local_28c,in_stack_fffffffffffffd10);
              auVar21._8_8_ = 0;
              auVar21._0_8_ = dVar4;
              auVar19._8_8_ = 0;
              auVar22._8_8_ = 0;
              auVar22._0_8_ = local_270;
              auVar19 = vfmadd213sd_fma(auVar19,auVar21,auVar22);
              local_270 = auVar19._0_8_;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
            }
          }
          sVar16 = std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::size
                             ((list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *)
                              in_stack_fffffffffffffb00);
          if (((sVar16 < *(ulong *)(in_RDI + 0x120)) || (local_210 < local_270)) &&
             ((((byte)in_RDI[0x128] & 1) == 0 || ((double)local_218 < local_270)))) {
            sVar16 = std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::size
                               ((list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *)
                                in_stack_fffffffffffffb00);
            if (sVar16 == *(size_type *)(in_RDI + 0x120)) {
              ppJVar17 = std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::back
                                   ((list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *)
                                    in_stack_fffffffffffffb00);
              if (*ppJVar17 != (value_type)0x0) {
                (**(code **)(*(long *)*ppJVar17 + 8))();
              }
              std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::pop_back
                        ((list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *)
                         in_stack_fffffffffffffb00);
            }
            in_stack_fffffffffffffd08 = (JPPVValuePair *)operator_new(0x20);
            JPPVValuePair::JPPVValuePair
                      (in_stack_fffffffffffffd08,(shared_ptr *)&local_230,local_270);
            OrderedInsertJPPVValuePair
                      ((JPPVValuePair *)in_stack_fffffffffffffb60,
                       (list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *)
                       in_stack_fffffffffffffb58);
            ppJVar17 = std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::back
                                 ((list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *)
                                  in_stack_fffffffffffffb00);
            in_stack_fffffffffffffd00 = *ppJVar17;
            local_210 = (double)(**(code **)(*(long *)in_stack_fffffffffffffd00 + 0x18))();
          }
          boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
                    ((shared_ptr<JointPolicyPureVector> *)0x139f98);
        }
        if (((byte)in_RDI[0x128] & 1) != 0) {
          ppJVar17 = std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::back
                               ((list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *)
                                in_stack_fffffffffffffb00);
          local_308 = *ppJVar17;
          in_stack_fffffffffffffb60 = (PolicyPureVector *)(**(code **)(*(long *)local_308 + 0x18))()
          ;
          local_218 = in_stack_fffffffffffffb60;
        }
        ppJVar17 = std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::front
                             ((list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *)
                              in_stack_fffffffffffffb00);
        in_stack_fffffffffffffb58 = (BayesianGameBase *)(**(code **)(*(long *)*ppJVar17 + 0x18))();
        local_310 = in_stack_fffffffffffffb58;
        if ((double)local_10 < (double)in_stack_fffffffffffffb58) {
          local_10 = in_stack_fffffffffffffb58;
          bVar5 = BayesianGameIdenticalPayoffSolver::GetWriteAnyTimeResults(in_RDI);
          in_stack_fffffffffffffb54 = CONCAT13(bVar5,(int3)in_stack_fffffffffffffb54);
          if (bVar5) {
            local_328 = local_f0[0].tv_sec;
            _Stack_320 = local_f0[0].tv_usec;
            local_338 = local_100;
            _Stack_330 = _Stack_f8;
            tVar3.tv_usec = local_f0[0].tv_usec;
            tVar3.tv_sec = local_f0[0].tv_sec;
            tVar2.tv_usec = _Stack_f8;
            tVar2.tv_sec = local_100;
            local_318 = (double)TimeTools::GetDeltaTimeDouble(tVar3,tVar2);
            in_stack_fffffffffffffb40 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 BayesianGameIdenticalPayoffSolver::GetResultsOFStream(in_RDI);
            in_stack_fffffffffffffb38 =
                 (I_PtPDpure_constPtr *)
                 std::ostream::operator<<((ostream *)in_stack_fffffffffffffb40,(double)local_10);
            std::operator<<((ostream *)in_stack_fffffffffffffb38,"\t");
            in_stack_fffffffffffffb30 =
                 BayesianGameIdenticalPayoffSolver::GetTimingsOFStream(in_RDI);
            poVar18 = (ostream *)
                      std::ostream::operator<<((ostream *)in_stack_fffffffffffffb30,local_318);
            std::operator<<(poVar18,"\t");
          }
          std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::front
                    ((list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *)
                     in_stack_fffffffffffffb00);
          JPPVValuePair::GetJPPV((JPPVValuePair *)in_stack_fffffffffffffaf8);
          in_stack_fffffffffffffb20 =
               (shared_ptr<JointPolicyPureVector> *)
               boost::shared_ptr<JointPolicyPureVector>::operator*(&local_348);
          JointPolicyPureVector::operator=
                    (local_a8,(JointPolicyPureVector *)in_stack_fffffffffffffb20);
          boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
                    ((shared_ptr<JointPolicyPureVector> *)0x13a1c3);
        }
        UpdateCEProbDistribution
                  ((BGIP_SolverCE *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                   (vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                    *)in_stack_fffffffffffffd08,
                   (list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *)
                   in_stack_fffffffffffffd00);
        while (bVar5 = std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::empty
                                 (&local_208), ((bVar5 ^ 0xffU) & 1) != 0) {
          ppJVar17 = std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::front
                               ((list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *)
                                in_stack_fffffffffffffb00);
          in_stack_fffffffffffffb18 = (I_PtPDpure_constPtr *)*ppJVar17;
          if (in_stack_fffffffffffffb18 != (I_PtPDpure_constPtr *)0x0) {
            (**(code **)(in_stack_fffffffffffffb18->px + 8))();
          }
          std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::pop_front
                    ((list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *)
                     in_stack_fffffffffffffb00);
        }
        std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::~list
                  ((list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *)0x13a263);
      }
    }
    bVar5 = BayesianGameIdenticalPayoffSolver::GetWriteAnyTimeResults(in_RDI);
    uVar25 = CONCAT13(bVar5,(int3)in_stack_fffffffffffffb14);
    if (bVar5) {
      this_00 = BayesianGameIdenticalPayoffSolver::GetResultsOFStream(in_RDI);
      std::ostream::operator<<((ostream *)this_00,std::endl<char,std::char_traits<char>>);
      in_stack_fffffffffffffb00 = BayesianGameIdenticalPayoffSolver::GetTimingsOFStream(in_RDI);
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffffb00,std::endl<char,std::char_traits<char>>);
    }
    BayesianGameIdenticalPayoffSolver::AddSolution
              ((BayesianGameIdenticalPayoffSolver *)in_stack_fffffffffffffb00,
               in_stack_fffffffffffffaf8,6.35841735440559e-318);
    pBVar24 = local_10;
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::~vector((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               *)CONCAT44(uVar25,in_stack_fffffffffffffb10));
    JointPolicyPureVector::~JointPolicyPureVector
              ((JointPolicyPureVector *)in_stack_fffffffffffffb00);
    return (double)pBVar24;
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar8 = "Error with gettimeofday";
  __cxa_throw(puVar8,&char_const*::typeinfo,0);
}

Assistant:

double Solve()
        {
            InitDeadline();

            double v_best = -DBL_MAX;
            //Index jpolI_best = 0;
            JointPolicyPureVector jpol_best(this->GetBGIPI(), TYPE_INDEX); //temporary?
            
            struct timeval start_time, cur_time;
            if(gettimeofday(&start_time, NULL) != 0)
                throw "Error with gettimeofday";
            
        //the algorithm has the following form
        //create initial joint policy distribution
        //for number of restarts
            //while improving
                //sample joint policies
                //evaluate and rank the sampled policies
                //update the probability distribution

            //get some vars:
            size_t nrAgents = this->GetBGIPI()->GetNrAgents();
            size_t nrJT = this->GetBGIPI()->GetNrJointTypes();

            //create initial joint policy distribution
            //Xi is the parameter 'std::vector' for the joint probability distribution 
            //with the following form:
            //Xi[agentI][typeI][actionI] (= Pr(actionI | typeI, agentI) )
            std::vector< std::vector< std::vector<double> > > Xi (nrAgents);
            for(Index agentI=0; agentI < nrAgents; agentI++)
            {
                size_t nrTypes = 
                    this->GetBGIPI()->GetNrPolicyDomainElements(agentI, 
                                                             TYPE_INDEX);
                size_t nrAcs = this->GetBGIPI()->GetNrActions(agentI);
                std::vector< std::vector<double> > ta_vec =
                    std::vector< std::vector<double> >(nrTypes, 
                                             std::vector<double>(nrAcs, 1.0 / nrAcs) ); //uniform dist. at start
                Xi.at(agentI)=ta_vec;
            }

            //for number of restarts
            for(Index restart=0; restart < _m_nrRestarts; restart++)
            {
                //for now, we use a fixed number of iterations:
                for(Index iter=0; iter < _m_nrIterations; iter++)
                {
                    CheckDeadline("CE deadline exceeded");

                    std::list<JPPVValuePair*> best_samples;
                    double v_xth_best = -DBL_MAX;
                    double v_gamma = -DBL_MAX;
                    for(Index sample=0; sample < _m_nrSampledJointPolicies; sample++)
                    {
                        boost::shared_ptr<JointPolicyPureVector> p_jpol =
                            boost::shared_ptr<JointPolicyPureVector>(new JointPolicyPureVector( this->GetBGIPI() ));
                        //sample next joint policy
                        std::vector< PolicyPureVector* > & BGpolicies = p_jpol->
                            GetIndividualPolicies();
                        for(Index agentI=0; agentI < nrAgents; agentI++)
                            //sample individual policy for next agent
                            SampleIndividualPolicy(*(BGpolicies.at(agentI)),Xi[agentI]);
#if DEBUG_BGIP_SOLVER_CE
                        {
                            std::cout << "sampled new policy: "<<
                                p_jpol->GetIndex();
                        }
#endif                
                        //evaluate 
                        double v = 0.0;        

                        const BayesianGameIdenticalPayoffInterface* bgipRawPtr=this->GetBGIPI().get();
                        for(Index jt = 0; jt < nrJT; jt++)
                        {
                            if(jt % 10000 == 0)
                                CheckDeadline("CE deadline exceeded");

                            double P_jt = bgipRawPtr->GetProbability(jt);
                            if(P_jt>0)
                            {
                                const std::vector<Index>& indTypes = bgipRawPtr->
                                    JointToIndividualTypeIndices(jt);
                                std::vector<Index> indAcs(nrAgents, 0);
                                //determine action of agentI 
                                for(Index agentI=0; agentI < nrAgents; agentI++)
                                    indAcs.at(agentI) = BGpolicies.at(agentI)->
                                        GetActionIndex(indTypes.at(agentI));
                                
                                Index ja = bgipRawPtr->IndividualToJointActionIndices(indAcs);
                                v += P_jt * bgipRawPtr->GetUtility(jt, ja);
                            }
                        }
#if DEBUG_BGIP_SOLVER_CE
                        std::cout << ", value="<<v<<std::endl;
#endif                
                        //retain it if it ranks among the best...
                        //we maintain an ordered std::list with contains the x best
                        //policies (pol-val pairs). (x = _m_nrJointPoliciesForUpdate)
                        //front() is the highest ranked policy and
                        //back() the lowest ranked one.
                        if(
                            //either we have not sampled x policies
                            (   best_samples.size() <  _m_nrJointPoliciesForUpdate
                                || 
                                //or the value of this policy is better 
                                (v > v_xth_best)
                                )
                            &&  ( (!_m_use_gamma) || (v > v_gamma)  )
                            )
                        {
                            if (best_samples.size() ==  _m_nrJointPoliciesForUpdate)
                            {
#if DEBUG_BGIP_SOLVER_CE
                                std::cout << "best_samples full: making space...";
#endif
                                delete best_samples.back();
                                best_samples.pop_back(); //make room
                            }
                            JPPVValuePair* polval = new JPPVValuePair(p_jpol,v);
                            OrderedInsertJPPVValuePair(polval, best_samples);
                            JPPVValuePair* back = best_samples.back();
                            v_xth_best = back->GetValue();
#if DEBUG_BGIP_SOLVER_CE
                            std::cout << "inserted pol (v="<<v<<") - v_xth_best now:"
                                 << v_xth_best << std::endl;
                            std::cout <<"best_samples contains the following pol/val pairs:"
                                 << std::endl;
                            PrintBestSamples(best_samples);
                            std::cout << std::endl;
#endif
                        }
                        else
                        {
//                            delete p_jpol;
                        }
                    } //end for samples
                    if(_m_use_gamma) //update the gamma
                    {
                        JPPVValuePair* back = best_samples.back();
                        v_gamma = back->GetValue();
#if DEBUG_BGIP_SOLVER_CE
                        std::cout << "new v_gamma="<<v_gamma<<std::endl;
#endif
                    }
                    //retain the very best sample:
                    double v_best_this_iter = best_samples.front()->GetValue();
                    if(v_best_this_iter > v_best)
                    {
#if DEBUG_BGIP_SOLVER_CE
                        std::cout << "new absolute best="<<v_best_this_iter <<
                            " (old="<< v_best <<")"<<std::endl;
#endif
                        v_best = v_best_this_iter;
                        if(this->GetWriteAnyTimeResults()){
                            double delta  = TimeTools::GetDeltaTimeDouble(start_time, cur_time);

                            (*this->GetResultsOFStream()) << v_best << "\t";
                            (*this->GetTimingsOFStream()) << delta << "\t";
                            
                        }
                        //LIndex too short...
                        //jpolI_best = best_samples.front()->GetJPPV()->GetIndex();
                        jpol_best =  *(best_samples.front()->GetJPPV());
                    }
                
                    //update the probability distribution
                    UpdateCEProbDistribution(Xi, best_samples);
#if DEBUG_BGIP_SOLVER_CE
                    for(Index agentI=0; agentI < nrAgents; agentI++)
                    {
                        std::cout << "updated parameter std::vector for agent "<<agentI<<":";
                        PrintVectorCout(Xi[agentI]);
                        std::cout << std::endl;
                    }
#endif
                    //delete std::list
                    while(!best_samples.empty())
                    {
                        delete best_samples.front();
                        best_samples.pop_front();
                    }
                } //end iteration
            } // end restart
            //end the line in the results file
            if(this->GetWriteAnyTimeResults()){
                (*this->GetResultsOFStream()) << std::endl;
                (*this->GetTimingsOFStream()) << std::endl;
            } 

            //JointPolicyPureVector best_found(*this->GetBGIPI());
            //best_found.SetIndex(jpolI_best);
            //_m_solution.SetPolicy(best_found);

            this->AddSolution(jpol_best,v_best);
            
            return(v_best);
        }